

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderObjdump *this,Index segment_index,Index func_index)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pcVar3;
  undefined1 local_30 [8];
  string_view name;
  Index func_index_local;
  Index segment_index_local;
  BinaryReaderObjdump *this_local;
  
  name.size_._0_4_ = func_index;
  name.size_._4_4_ = segment_index;
  PrintDetails(this,"  - elem[%u] = func[%u]",(ulong)(this->elem_offset_ + this->elem_index_),
               (ulong)func_index);
  _local_30 = BinaryReaderObjdumpBase::GetFunctionName
                        (&this->super_BinaryReaderObjdumpBase,(Index)name.size_);
  bVar1 = string_view::empty((string_view *)local_30);
  if (!bVar1) {
    sVar2 = string_view::length((string_view *)local_30);
    pcVar3 = string_view::data((string_view *)local_30);
    PrintDetails(this," <%.*s>",sVar2 & 0xffffffff,pcVar3);
  }
  PrintDetails(this,"\n");
  this->elem_index_ = this->elem_index_ + 1;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                          Index func_index) {
  PrintDetails("  - elem[%" PRIindex "] = func[%" PRIindex "]",
               elem_offset_ + elem_index_, func_index);
  auto name = GetFunctionName(func_index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  elem_index_++;
  return Result::Ok;
}